

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::copyStruct
               (SegmentBuilder *segment,CapTableBuilder *capTable,word *dst,word *src,
               StructDataWordCount dataSize,StructPointerCount pointerCount)

{
  bool bVar1;
  unsigned_short *puVar2;
  uint count;
  WirePointer *local_68;
  WirePointer *dstRef;
  SegmentBuilder *subSegment;
  Iterator local_50;
  Iterator local_4e;
  Range<unsigned_short> RStack_4c;
  unsigned_short i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_short> *__range2;
  WirePointer *dstRefs;
  WirePointer *srcRefs;
  StructPointerCount pointerCount_local;
  StructDataWordCount dataSize_local;
  word *src_local;
  word *dst_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  
  count = (uint)dataSize;
  copyMemory(dst,src,count);
  RStack_4c = kj::zeroTo<unsigned_short>(pointerCount);
  ___end2 = &stack0xffffffffffffffb4;
  local_4e = kj::Range<unsigned_short>::begin(___end2);
  local_50 = kj::Range<unsigned_short>::end(___end2);
  while( true ) {
    bVar1 = kj::Range<unsigned_short>::Iterator::operator!=(&local_4e,&local_50);
    if (!bVar1) break;
    puVar2 = kj::Range<unsigned_short>::Iterator::operator*(&local_4e);
    subSegment._6_2_ = *puVar2;
    local_68 = (WirePointer *)(dst + (long)(int)count + (long)(int)(uint)subSegment._6_2_);
    dstRef = (WirePointer *)segment;
    copyMessage((SegmentBuilder **)&dstRef,capTable,&local_68,
                (WirePointer *)(src + (long)(int)count + (long)(int)(uint)subSegment._6_2_));
    kj::Range<unsigned_short>::Iterator::operator++(&local_4e);
  }
  return;
}

Assistant:

static KJ_ALWAYS_INLINE(
      void copyStruct(SegmentBuilder* segment, CapTableBuilder* capTable,
                      word* dst, const word* src,
                      StructDataWordCount dataSize, StructPointerCount pointerCount)) {
    copyMemory(dst, src, dataSize);

    const WirePointer* srcRefs = reinterpret_cast<const WirePointer*>(src + dataSize);
    WirePointer* dstRefs = reinterpret_cast<WirePointer*>(dst + dataSize);

    for (auto i: kj::zeroTo(pointerCount)) {
      SegmentBuilder* subSegment = segment;
      WirePointer* dstRef = dstRefs + i;
      copyMessage(subSegment, capTable, dstRef, srcRefs + i);
    }
  }